

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# https.c
# Opt level: O1

char * strtoken(char *src,char *dst,int size)

{
  char *__src;
  byte bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  char *pcVar9;
  
  lVar5 = 0;
  do {
    bVar1 = src[lVar5];
    if (bVar1 < 10) {
      if (bVar1 != 9) break;
    }
    else if (bVar1 != 0x20) {
      if (bVar1 != 10) goto LAB_001106e9;
      goto LAB_00110710;
    }
    lVar5 = lVar5 + 1;
  } while( true );
  if (bVar1 == 0) {
LAB_00110710:
    pcVar9 = (char *)0x0;
  }
  else {
LAB_001106e9:
    __src = src + lVar5;
    lVar8 = 0;
    while( true ) {
      cVar2 = src[lVar5 + lVar8];
      lVar3 = lVar8;
      if ((cVar2 == '\0') || (cVar2 == '\n')) goto LAB_00110722;
      if (cVar2 == ' ') break;
      lVar8 = lVar8 + 1;
    }
    lVar3 = lVar8 + 1;
LAB_00110722:
    pcVar9 = __src + lVar3;
    pcVar7 = __src + lVar8 + -1;
    if (lVar8 != 1) {
      lVar8 = -(lVar8 + -1);
      do {
        if ((*pcVar7 != ' ') && (*pcVar7 != '\t')) break;
        pcVar7 = pcVar7 + -1;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0);
    }
    iVar6 = (((int)pcVar7 - (int)src) - (int)lVar5) + 1;
    iVar4 = size + -1;
    if (iVar6 < size) {
      iVar4 = iVar6;
    }
    if (size < 1) {
      iVar4 = iVar6;
    }
    strncpy(dst,__src,(long)iVar4);
    dst[iVar4] = '\0';
  }
  return pcVar9;
}

Assistant:

char *strtoken(char *src, char *dst, int size)
{
    char *p, *st, *ed;
    int  len = 0;

    // l-trim
    p = src;

    while(TRUE)
    {
        if((*p == '\n') || (*p == 0)) return NULL; /* value is not exists */
        if((*p != ' ') && (*p != '\t')) break;
        p++;
    }

    st = p;
    while(TRUE)
    {
        ed = p;
        if(*p == ' ') {
            p++;
            break;
        }
        if((*p == '\n') || (*p == 0)) break;
        p++;
    }

    // r-trim
    while(TRUE)
    {
        ed--;
        if(st == ed) break;
        if((*ed != ' ') && (*ed != '\t')) break;
    }

    len = (int)(ed - st + 1);
    if((size > 0) && (len >= size)) len = size - 1;

    strncpy(dst, st, len);
    dst[len]=0;

    return p;
}